

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void raviX_destroy_linearizer(LinearizerState *linearizer)

{
  void *pvVar1;
  PtrListIterator prociter__;
  PtrListIterator local_30;
  
  if (linearizer != (LinearizerState *)0x0) {
    raviX_ptrlist_forward_iterator(&local_30,(PtrList *)linearizer->all_procs);
    pvVar1 = raviX_ptrlist_iter_next(&local_30);
    if (pvVar1 != (void *)0x0) {
      do {
        if (*(Set **)((long)pvVar1 + 0xf8) != (Set *)0x0) {
          raviX_set_destroy(*(Set **)((long)pvVar1 + 0xf8),(_func_void_SetEntry_ptr *)0x0);
        }
        if (*(Graph **)((long)pvVar1 + 0x108) != (Graph *)0x0) {
          raviX_destroy_graph(*(Graph **)((long)pvVar1 + 0x108));
        }
        pvVar1 = raviX_ptrlist_iter_next(&local_30);
      } while (pvVar1 != (void *)0x0);
    }
    raviX_buffer_free(&linearizer->C_declarations);
    raviX_free(linearizer);
  }
  return;
}

Assistant:

void raviX_destroy_linearizer(LinearizerState *linearizer)
{
	if (linearizer == NULL)
		return;
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
	{
		if (proc->constants)
			raviX_set_destroy(proc->constants, NULL);
		if (proc->cfg) 
			raviX_destroy_graph(proc->cfg);
	}
	END_FOR_EACH_PTR(proc)
	raviX_buffer_free(&linearizer->C_declarations);
	raviX_free(linearizer);
}